

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O3

Value ** __thiscall
ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(ValueHashTable<Sym_*,_Value_*> *this,Sym *value)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Type *pTVar4;
  uint depth;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  uVar1 = value->m_id;
  local_50 = (undefined1  [8])(this->table + (ulong)uVar1 % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_50;
  iter.last = (NodeBase *)value;
  bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
          ::Next((EditingIterator *)local_50);
  depth = 1;
  if (bVar3) {
    do {
      pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)local_50);
      uVar2 = pTVar4->value->m_id;
      if (uVar2 <= uVar1) {
        if (uVar2 == uVar1) {
          return &pTVar4->element;
        }
        break;
      }
      depth = depth + 1;
      bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_50);
    } while (bVar3);
  }
  pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
           ::InsertNodeBefore((EditingIterator *)local_50,&this->alloc->super_ArenaAllocator);
  pTVar4->value = (Sym *)iter.last;
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,depth);
  }
  return &pTVar4->element;
}

Assistant:

TElement * FindOrInsertNew(TData value)
    {
        uint key = Key::Get(value);
        uint hash = this->Hash(key);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, &this->table[hash], iter)
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        HashBucket * newBucket = iter.InsertNodeBefore(this->alloc);
        newBucket->value = value;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return &newBucket->element;
    }